

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O3

pair<robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::Iter<false>,_bool>
* __thiscall
robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>::
emplace<robin_hood::pair<char,double>>
          (pair<robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::Iter<false>,_bool>
           *__return_storage_ptr__,
          Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>> *this,
          pair<char,_double> *args)

{
  undefined8 *puVar1;
  long lVar2;
  unsigned_long uVar3;
  InsertionState IVar4;
  pair<unsigned_long,_robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::InsertionState>
  pVar5;
  Node n;
  undefined8 local_38;
  double dStack_30;
  
  local_38 = *(undefined8 *)args;
  dStack_30 = args->second;
  pVar5 = insertKeyPrepareEmptySpot<char_const&>(this,(char *)&local_38);
  uVar3 = pVar5.first;
  IVar4 = pVar5.second;
  if (IVar4 == overflow_error) {
    Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::
    throwOverflowError((Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>
                        *)this);
  }
  else if ((IVar4 == overwrite_node) || (IVar4 == new_node)) {
    puVar1 = (undefined8 *)(*(long *)(this + 8) + uVar3 * 0x10);
    *puVar1 = local_38;
    puVar1[1] = dStack_30;
  }
  lVar2 = *(long *)(this + 0x10);
  (__return_storage_ptr__->first).mKeyVals = (NodePtr)(uVar3 * 0x10 + *(long *)(this + 8));
  (__return_storage_ptr__->first).mInfo = (uint8_t *)(lVar2 + uVar3);
  __return_storage_ptr__->second = IVar4 != key_found;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> emplace(Args&&... args) {
        ROBIN_HOOD_TRACE(this)
        Node n{*this, std::forward<Args>(args)...};
        auto idxAndState = insertKeyPrepareEmptySpot(getFirstConst(n));
        switch (idxAndState.second) {
        case InsertionState::key_found:
            n.destroy(*this);
            break;

        case InsertionState::new_node:
            ::new (static_cast<void*>(&mKeyVals[idxAndState.first])) Node(*this, std::move(n));
            break;

        case InsertionState::overwrite_node:
            mKeyVals[idxAndState.first] = std::move(n);
            break;

        case InsertionState::overflow_error:
            n.destroy(*this);
            throwOverflowError();
            break;
        }

        return std::make_pair(iterator(mKeyVals + idxAndState.first, mInfo + idxAndState.first),
                              InsertionState::key_found != idxAndState.second);
    }